

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

void __thiscall
QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::insertRow
          (FixedColumnMatrix<QFormLayoutItem_*,_2> *this,int r,QFormLayoutItem **value)

{
  int in_ESI;
  qsizetype in_RDI;
  long in_FS_OFFSET;
  iterator it;
  QList<QFormLayoutItem_*> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  iterator this_00;
  const_iterator local_18;
  iterator local_10;
  const_iterator before;
  
  before.i = *(QFormLayoutItem ***)(in_FS_OFFSET + 0x28);
  local_10.i = (QFormLayoutItem **)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<QFormLayoutItem_*>::begin(in_stack_ffffffffffffffc0);
  QList<QFormLayoutItem_*>::iterator::operator+=(&local_10,(long)(in_ESI * 2));
  this_00.i = local_10.i;
  QList<QFormLayoutItem_*>::const_iterator::const_iterator(&local_18,local_10);
  QList<QFormLayoutItem_*>::insert
            ((QList<QFormLayoutItem_*> *)this_00.i,before,in_RDI,
             (parameter_type)CONCAT44(in_ESI,in_stack_ffffffffffffffd0));
  if (*(QFormLayoutItem ***)(in_FS_OFFSET + 0x28) == before.i) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void FixedColumnMatrix<T, NumColumns>::insertRow(int r, const T &value)
{
    typename Storage::iterator it = m_storage.begin();
    it += r * NumColumns;
    m_storage.insert(it, NumColumns, value);
}